

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O1

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_SetSuppressCallbackMode
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,ECallbackSuppressMode mode)

{
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  undefined4 in_register_00000034;
  ExceptionReporter<GenICam_3_4::AccessException> local_c0;
  
  if (this->_Ptr != (INodeMap *)0x0) {
    (**(code **)(*(long *)this->_Ptr + 0x70))();
    return;
  }
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)
            __cxa_allocate_exception(0x1f0,CONCAT44(in_register_00000034,mode));
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/NodeMapRef.h"
             ,0x1c0,"AccessException");
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,(char *)&local_c0,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::GenericException::~GenericException);
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_SetSuppressCallbackMode(ECallbackSuppressMode mode) const
    {
        if (_Ptr)
            return _Ptr->SetSuppressCallbackMode(mode);
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }